

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O2

void __thiscall
slang::ast::EventListControl::serializeTo(EventListControl *this,ASTSerializer *serializer)

{
  pointer ppTVar1;
  size_type sVar2;
  long lVar3;
  string_view name;
  
  name._M_str = "events";
  name._M_len = 6;
  ASTSerializer::startArray(serializer,name);
  ppTVar1 = (this->events).data_;
  sVar2 = (this->events).size_;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    ASTSerializer::serialize(serializer,*(TimingControl **)((long)ppTVar1 + lVar3));
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void EventListControl::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("events");
    for (auto const event : events) {
        serializer.serialize(*event);
    }
    serializer.endArray();
}